

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

void __thiscall CLI::OptionNotFound::~OptionNotFound(OptionNotFound *this)

{
  void *in_RDI;
  
  ~OptionNotFound((OptionNotFound *)0x144b28);
  operator_delete(in_RDI);
  return;
}

Assistant:

explicit OptionNotFound(std::string name) : OptionNotFound(name + " not found", ExitCodes::OptionNotFound) {}